

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ManAppendXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  pGVar5 = Gia_ManAppendObj(p);
  if (iLit0 < 0) {
LAB_007c63c7:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar7 = (uint)iLit0 >> 1;
  iVar1 = p->nObjs;
  if (iVar1 <= (int)uVar7) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  if (iLit1 < 0) goto LAB_007c63c7;
  uVar6 = (uint)iLit1 >> 1;
  if (iVar1 <= (int)uVar6) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  if (uVar7 == uVar6) {
    __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  pGVar2 = p->pObjs;
  iVar4 = (int)pGVar5;
  if (uVar6 < uVar7) {
    if (pGVar2 + iVar1 <= pGVar5 || pGVar5 < pGVar2) goto LAB_007c63a8;
    uVar3 = *(ulong *)pGVar5;
    uVar9 = (ulong)((iLit0 & 1U) << 0x1d |
                   ((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff);
    *(ulong *)pGVar5 = uVar9 | uVar3 & 0xffffffffc0000000;
    pGVar2 = p->pObjs;
    if ((pGVar5 < pGVar2) || (pGVar2 + p->nObjs <= pGVar5)) goto LAB_007c63a8;
    uVar8 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) << 0x20;
    *(ulong *)pGVar5 = uVar9 | uVar3 & 0xe0000000c0000000 | uVar8;
    uVar11 = (ulong)(iLit1 & 1) << 0x3d;
    uVar8 = uVar9 | uVar3 & 0xc0000000c0000000 | uVar8;
  }
  else {
    if (pGVar2 + iVar1 <= pGVar5 || pGVar5 < pGVar2) goto LAB_007c63a8;
    uVar3 = *(ulong *)pGVar5;
    uVar9 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff) << 0x20;
    uVar10 = (ulong)(iLit0 & 1) << 0x3d;
    *(ulong *)pGVar5 = uVar10 | uVar3 & 0xc0000000ffffffff | uVar9;
    pGVar2 = p->pObjs;
    if ((pGVar5 < pGVar2) || (pGVar2 + p->nObjs <= pGVar5)) goto LAB_007c63a8;
    uVar8 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
    *(ulong *)pGVar5 = uVar10 | uVar3 & 0xc0000000e0000000 | uVar9 | uVar8;
    uVar11 = (ulong)((iLit1 & 1U) << 0x1d);
    uVar8 = uVar10 | uVar3 & 0xc0000000c0000000 | uVar9 | uVar8;
  }
  *(ulong *)pGVar5 = uVar8 | uVar11;
  p->nXors = p->nXors + 1;
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pGVar5) && (pGVar5 < pGVar2 + p->nObjs)) {
    return (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * 0x55555556;
  }
LAB_007c63a8:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    //assert( !Abc_LitIsCompl(iLit0) );
    //assert( !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) > Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    else
    {
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    p->nXors++;
    return Gia_ObjId( p, pObj ) << 1;
}